

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int open_get_offered_capabilities(OPEN_HANDLE open,AMQP_VALUE *offered_capabilities_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  int iVar3;
  AMQP_VALUE pAVar4;
  bool bVar5;
  uint32_t item_count;
  char *offered_capabilities_single_value;
  
  if (open == (OPEN_HANDLE)0x0) {
    iVar3 = 0x728;
  }
  else {
    iVar1 = amqpvalue_get_composite_item_count(open->composite_value,&item_count);
    iVar3 = 0x730;
    if ((iVar1 == 0) && (iVar3 = 0x736, 7 < item_count)) {
      pAVar4 = amqpvalue_get_composite_item_in_place(open->composite_value,7);
      iVar3 = 0x73e;
      if ((pAVar4 != (AMQP_VALUE)0x0) &&
         (AVar2 = amqpvalue_get_type(pAVar4), AVar2 != AMQP_TYPE_NULL)) {
        AVar2 = amqpvalue_get_type(pAVar4);
        if (AVar2 == AMQP_TYPE_ARRAY) {
          offered_capabilities_single_value = (char *)0x0;
          bVar5 = true;
        }
        else {
          iVar3 = amqpvalue_get_symbol(pAVar4,&offered_capabilities_single_value);
          bVar5 = iVar3 != 0;
        }
        AVar2 = amqpvalue_get_type(pAVar4);
        if (AVar2 == AMQP_TYPE_ARRAY) {
          iVar3 = amqpvalue_get_array(pAVar4,offered_capabilities_value);
          if ((bool)(iVar3 != 0 & bVar5)) {
            return 0x751;
          }
        }
        else if (bVar5) {
          return 0x751;
        }
        AVar2 = amqpvalue_get_type(pAVar4);
        iVar3 = 0;
        if (AVar2 != AMQP_TYPE_ARRAY) {
          pAVar4 = amqpvalue_create_array();
          *offered_capabilities_value = pAVar4;
          if (pAVar4 == (AMQP_VALUE)0x0) {
            iVar3 = 0x75a;
          }
          else {
            pAVar4 = amqpvalue_create_symbol(offered_capabilities_single_value);
            if (pAVar4 == (AMQP_VALUE)0x0) {
              iVar3 = 0x761;
            }
            else {
              iVar1 = amqpvalue_add_array_item(*offered_capabilities_value,pAVar4);
              iVar3 = 0x767;
              if (iVar1 == 0) {
                iVar1 = amqpvalue_set_composite_item
                                  (open->composite_value,7,*offered_capabilities_value);
                iVar3 = 0x76d;
                if (iVar1 == 0) {
                  iVar3 = 0;
                }
              }
              amqpvalue_destroy(pAVar4);
            }
            amqpvalue_destroy(*offered_capabilities_value);
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int open_get_offered_capabilities(OPEN_HANDLE open, AMQP_VALUE* offered_capabilities_value)
{
    int result;

    if (open == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)open;
        if (amqpvalue_get_composite_item_count(open_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 7)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(open_instance->composite_value, 7);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    const char* offered_capabilities_single_value;
                    int get_single_value_result;
                    if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                    {
                        get_single_value_result = amqpvalue_get_symbol(item_value, &offered_capabilities_single_value);
                    }
                    else
                    {
                        (void)memset((void*)&offered_capabilities_single_value, 0, sizeof(offered_capabilities_single_value));
                        get_single_value_result = 1;
                    }

                    if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, offered_capabilities_value) != 0)) &&
                        (get_single_value_result != 0))
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                        {
                            *offered_capabilities_value = amqpvalue_create_array();
                            if (*offered_capabilities_value == NULL)
                            {
                                result = MU_FAILURE;
                            }
                            else
                            {
                                AMQP_VALUE single_amqp_value = amqpvalue_create_symbol(offered_capabilities_single_value);
                                if (single_amqp_value == NULL)
                                {
                                    result = MU_FAILURE;
                                }
                                else
                                {
                                    if (amqpvalue_add_array_item(*offered_capabilities_value, single_amqp_value) != 0)
                                    {
                                        result = MU_FAILURE;
                                    }
                                    else
                                    {
                                        if (amqpvalue_set_composite_item(open_instance->composite_value, 7, *offered_capabilities_value) != 0)
                                        {
                                            result = MU_FAILURE;
                                        }
                                        else
                                        {
                                            result = 0;
                                        }
                                    }

                                    amqpvalue_destroy(single_amqp_value);
                                }
                                amqpvalue_destroy(*offered_capabilities_value);
                            }
                        }
                        else
                        {
                            result = 0;
                        }
                    }
                }
            }
        }
    }

    return result;
}